

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_innerproduct(NetOptimize *this)

{
  int iVar1;
  Layer *pLVar2;
  int *piVar3;
  pointer ppLVar4;
  bool bVar5;
  Layer *pLVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  ParamDict pd;
  ParamDict local_930;
  
  uVar9 = (ulong)((long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->super_Net).layers.
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar8 = (int)uVar9;
  uVar11 = 0;
  if (0 < iVar8) {
    uVar11 = uVar9 & 0xffffffff;
  }
  uVar9 = 0;
  bVar10 = false;
  do {
    while (uVar9 == uVar11) {
      uVar9 = 0;
      bVar5 = !bVar10;
      bVar10 = false;
      if (bVar5) {
        return 0;
      }
    }
    bVar5 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9]->type,"InnerProduct");
    if (!bVar5) {
      iVar1 = *((this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar7 = uVar9;
      do {
        uVar7 = uVar7 + 1;
        if (iVar8 <= (int)uVar7) goto LAB_0011484c;
        bVar5 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar7]->type,"Convolution"
                               );
      } while (((bVar5) ||
               (pLVar2 = (this->super_Net).layers.
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7],
               piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
               (long)(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar3 != 4)) || (*piVar3 != iVar1));
      if ((int)uVar7 != iVar8) {
        ppLVar4 = (this->super_Net).layers.
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pLVar2 = ppLVar4[uVar7 & 0xffffffff];
        fprintf(_stderr,"replace_convolution_with_innerproduct_after_innerproduct %s %s\n",
                (ppLVar4[uVar9]->name)._M_dataplus._M_p,(pLVar2->name)._M_dataplus._M_p);
        pLVar6 = ncnn::create_layer("InnerProduct");
        std::__cxx11::string::assign((char *)&pLVar6->type);
        std::__cxx11::string::_M_assign((string *)&pLVar6->name);
        std::vector<int,_std::allocator<int>_>::operator=(&pLVar6->bottoms,&pLVar2->bottoms);
        std::vector<int,_std::allocator<int>_>::operator=(&pLVar6->tops,&pLVar2->tops);
        ncnn::ParamDict::ParamDict(&local_930);
        (*pLVar6->_vptr_Layer[2])(pLVar6,&local_930);
        *(undefined4 *)&pLVar6[1]._vptr_Layer = *(undefined4 *)&pLVar2[1]._vptr_Layer;
        *(pointer *)((long)&pLVar6[1]._vptr_Layer + 4) = pLVar2[1].name._M_dataplus._M_p;
        ncnn::Mat::operator=
                  ((Mat *)&pLVar6[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Mat *)(pLVar2 + 2));
        ncnn::Mat::operator=((Mat *)&pLVar6[2].type._M_string_length,(Mat *)&pLVar2[2].name.field_2)
        ;
        *(undefined4 *)&pLVar6[1].type._M_dataplus._M_p =
             *(undefined4 *)((long)&pLVar2[1].name._M_string_length + 4);
        ncnn::Mat::operator=((Mat *)&pLVar6[1].type._M_string_length,(Mat *)&pLVar2[1].name.field_2)
        ;
        (this->super_Net).layers.super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar7 & 0xffffffff] = pLVar6;
        (*pLVar2->_vptr_Layer[1])(pLVar2);
        ncnn::ParamDict::~ParamDict(&local_930);
        bVar10 = true;
      }
    }
LAB_0011484c:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_innerproduct()
{
    const int layer_count = layers.size();
    for (;;)
    {
    bool replaced = false;

    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Convolution
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_innerproduct %s %s\n", innerproduct->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct2 = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct2->type = "InnerProduct";
        innerproduct2->name = convolution->name;
        innerproduct2->bottoms = convolution->bottoms;
        innerproduct2->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct2->load_param(pd);

        innerproduct2->num_output = convolution->num_output;
        innerproduct2->bias_term = convolution->bias_term;
        innerproduct2->weight_data_size = convolution->weight_data_size;

        innerproduct2->weight_data = convolution->weight_data;
        innerproduct2->bias_data = convolution->bias_data;

        innerproduct2->activation_type = convolution->activation_type;
        innerproduct2->activation_params = convolution->activation_params;

        layers[j] = innerproduct2;
        delete convolution;

        replaced = true;
    }

    if (!replaced)
        break;
    }

    return 0;
}